

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# types.cpp
# Opt level: O1

bool __thiscall clickhouse::EnumType::HasEnumName(EnumType *this,string *name)

{
  iterator iVar1;
  
  iVar1 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_short>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_short>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_short>_>_>
          ::find(&(((((this->type_).super___shared_ptr<clickhouse::Type,_(__gnu_cxx::_Lock_policy)2>
                     ._M_ptr)->field_1).enum_)->name_to_value)._M_t,name);
  return iVar1._M_node !=
         &(((((this->type_).super___shared_ptr<clickhouse::Type,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
            ->field_1).enum_)->name_to_value)._M_t._M_impl.super__Rb_tree_header._M_header;
}

Assistant:

bool EnumType::HasEnumName(const std::string& name) const {
    return type_->enum_->name_to_value.find(name) != type_->enum_->name_to_value.end();
}